

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastBR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  byte bVar2;
  ulong *puVar3;
  SerialArena *this;
  __int_type_conflict _Var4;
  __pointer_type pSVar5;
  uint uVar6;
  long lVar7;
  Rep *pRVar8;
  string *s;
  char *pcVar9;
  string *psVar10;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *this_00;
  ulong uVar11;
  ulong uVar12;
  uint *puVar13;
  ushort *puVar14;
  pair<const_char_*,_int> pVar15;
  LogMessageFatal local_40 [16];
  
  if (data.field_0._0_1_ != '\0') {
    pcVar9 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  this_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
            ((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this_00 & 7) != 0) {
    AlignFail(this_00);
  }
  cVar1 = *ptr;
  puVar3 = (ulong *)this_00[2].data;
  if (puVar3 != (ulong *)0x0) {
    lVar7 = __tls_get_addr(&PTR_001b3f20);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(lVar7 + 8))->data;
    if (data.field_0.data == (anon_union_8_1_898a9ca8_for_TcFieldData_0)*puVar3) {
      this = *(SerialArena **)(lVar7 + 0x10);
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this_00->data;
      if (((ulong)data.field_0 & 1) == 0) {
        uVar6 = (uint)(data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0);
      }
      else {
        pRVar8 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this_00);
        uVar6 = pRVar8->allocated_size;
      }
      if (uVar6 == *(uint *)(this_00 + 1)) {
        do {
          bVar2 = *(byte *)((long)ptr + 1);
          puVar14 = (ushort *)(ulong)bVar2;
          uVar6 = (uint)bVar2;
          if ((char)bVar2 < '\0') {
            pVar15 = ReadSizeFallback((char *)((long)ptr + 1),(uint)bVar2);
            ctx_00 = pVar15._8_8_;
            if ((ushort *)pVar15.first == (ushort *)0x0) goto LAB_00153f8c;
            uVar6 = pVar15.second;
            puVar14 = (ushort *)pVar15.first;
          }
          else {
            puVar14 = (ushort *)((long)ptr + 2);
          }
          _Var4 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
          if (_Var4 == 0) {
            data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                           SerialArena::AllocateFromStringBlockFallback(this);
          }
          else {
            uVar12 = _Var4 - 0x20;
            (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = uVar12;
            pSVar5 = (this->string_block_)._M_b._M_p;
            uVar11 = (ulong)pSVar5->allocated_size_ - 0x10;
            if (uVar11 < uVar12) {
              psVar10 = absl::lts_20240722::log_internal::
                        MakeCheckOpString<unsigned_long,unsigned_long>
                                  (uVar12,uVar11,"offset <= effective_size()");
              absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                        (local_40,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/string_block.h"
                         ,0xa2,*(undefined8 *)(psVar10 + 8),*(undefined8 *)psVar10);
              absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
            }
            data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                           ((long)&pSVar5[-1].next_ + _Var4);
          }
          *(uint64_t *)data.field_0 = (long)data.field_0 + 0x10;
          *(undefined8 *)((long)data.field_0 + 8) = 0;
          *(undefined1 *)((long)data.field_0 + 0x10) = 0;
          RepeatedPtrFieldBase::AddAllocatedForParse
                    ((RepeatedPtrFieldBase *)this_00,(void *)data.field_0);
          ptr = EpsCopyInputStream::ReadString
                          (&ctx->super_EpsCopyInputStream,(char *)puVar14,uVar6,
                           (string *)data.field_0);
          ctx_00 = extraout_RDX;
          if ((ushort *)ptr == (ushort *)0x0) goto LAB_00153f8c;
          puVar14 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
          if (puVar14 <= ptr) goto LAB_00153f54;
          data.field_0._1_7_ = (undefined7)((ulong)data.field_0 >> 8);
          data.field_0.data._0_1_ = cVar1;
        } while ((char)*(ushort *)ptr == cVar1);
        goto LAB_00153f0a;
      }
    }
  }
  do {
    puVar14 = (ushort *)((long)ptr + 1);
    s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this_00);
    ptr = InlineGreedyStringParser(s,(char *)puVar14,ctx);
    ctx_00 = extraout_RDX_00;
    if ((ushort *)ptr == (ushort *)0x0) {
LAB_00153f8c:
      pcVar9 = Error(msg,(char *)puVar14,ctx_00,data,table,hasbits);
      return pcVar9;
    }
    puVar14 = (ushort *)(ctx->super_EpsCopyInputStream).limit_end_;
    if (puVar14 <= ptr) goto LAB_00153f54;
    data.field_0._1_7_ = (undefined7)((ulong)data.field_0 >> 8);
    data.field_0.data._0_1_ = cVar1;
  } while ((char)*(ushort *)ptr == cVar1);
LAB_00153f0a:
  if (ptr < puVar14) {
    uVar6 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
    if ((uVar6 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    uVar11 = (ulong)(uVar6 & 0xfffffff8);
    pcVar9 = (char *)(**(code **)(&table[1].has_bits_offset + uVar11))
                               (msg,ptr,ctx,
                                (ulong)*(ushort *)ptr ^
                                *(ulong *)(&table[1].fast_idx_mask + uVar11 * 2),table,hasbits);
    return pcVar9;
  }
LAB_00153f54:
  if ((ulong)table->has_bits_offset != 0) {
    puVar13 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar13 & 3) != 0) {
      AlignFail();
    }
    *puVar13 = *puVar13 | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastBR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedString<
      uint8_t, RepeatedPtrField<std::string>, kNoUtf8>(PROTOBUF_TC_PARAM_PASS);
}